

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

void CorUnix::MTX_InternalEnterCriticalSection
               (CPalThread *pThread,PCRITICAL_SECTION pCriticalSection)

{
  PalCsInitState PVar1;
  int iVar2;
  HANDLE pVVar3;
  SIZE_T threadId;
  int iRet;
  PAL_CRITICAL_SECTION *pPalCriticalSection;
  PCRITICAL_SECTION pCriticalSection_local;
  CPalThread *pThread_local;
  
  PVar1 = ::Volatile::operator_cast_to_PalCsInitState((Volatile *)&pCriticalSection->dwInitState);
  if (PVar1 == PalCsNotInitialized) {
    fprintf(_stderr,"] %s %s:%d","MTX_InternalEnterCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x5d7);
    fprintf(_stderr,"Expression: PalCsNotInitialized != pPalCriticalSection->cisInitState\n");
  }
  pVVar3 = (HANDLE)ObtainCurrentThreadIdImpl(pThread,"MTX_InternalEnterCriticalSection");
  if (pCriticalSection->OwningThread == pVVar3) {
    if (pCriticalSection->RecursionCount < 1) {
      fprintf(_stderr,"] %s %s:%d","MTX_InternalEnterCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x5de);
      fprintf(_stderr,"Expression: 0 < pPalCriticalSection->RecursionCount\n");
    }
    pCriticalSection->RecursionCount = pCriticalSection->RecursionCount + 1;
  }
  else {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&pCriticalSection->csnds);
    if (iVar2 != 0) {
      fprintf(_stderr,"] %s %s:%d","MTX_InternalEnterCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x5e4);
      fprintf(_stderr,"Expression: 0 == iRet\n");
    }
    pCriticalSection->OwningThread = pVVar3;
    pCriticalSection->RecursionCount = 1;
  }
  return;
}

Assistant:

void MTX_InternalEnterCriticalSection(
        CPalThread * pThread,
        PCRITICAL_SECTION pCriticalSection)
#endif // MUTEX_BASED_CSS

    {
        PAL_CRITICAL_SECTION * pPalCriticalSection =
            reinterpret_cast<PAL_CRITICAL_SECTION*>(pCriticalSection);
        int iRet;
        SIZE_T threadId;

        _ASSERTE(PalCsNotInitialized != pPalCriticalSection->cisInitState);

        threadId = ObtainCurrentThreadId(pThread);

        /* check if the current thread already owns the criticalSection */
        if (pPalCriticalSection->OwningThread == threadId)
        {
            _ASSERTE(0 < pPalCriticalSection->RecursionCount);
            pPalCriticalSection->RecursionCount += 1;
            return;
        }

        iRet = pthread_mutex_lock(&pPalCriticalSection->csndNativeData.mutex);
        _ASSERTE(0 == iRet);

        pPalCriticalSection->OwningThread = threadId;
        pPalCriticalSection->RecursionCount = 1;
    }